

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool Internal_FirstIsPartOfSecond(ON_SubDComponentPoint *first,ON_SubDComponentPoint *second)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  ON_SubDFace *f;
  uint uVar4;
  ON_SubDVertex *vertex;
  ON_SubDFace *this;
  
  uVar4 = (uint)first & 6;
  uVar3 = (uint)second & 6;
  uVar2 = 0x6020402020200 >> (sbyte)uVar3 * '\b';
  cVar1 = (char)uVar2;
  if ((char)(0x6020402020200 >> (sbyte)uVar4 * '\b') == cVar1) {
    return false;
  }
  if ((0x2eU >> uVar4 & 1) == 0) {
    if ((0x10U >> (sbyte)uVar4 & 0x40U >> (sbyte)uVar3 & 1) == 0) {
      return false;
    }
    this = (ON_SubDFace *)((ulong)first & 0xfffffffffffffff8);
    if (uVar4 != 4) {
      this = (ON_SubDFace *)0x0;
    }
    f = (ON_SubDFace *)((ulong)second & 0xfffffffffffffff8);
    if (uVar3 != 6) {
      f = (ON_SubDFace *)0x0;
    }
    if (f == (ON_SubDFace *)0x0 || this == (ON_SubDFace *)0x0) {
      return false;
    }
    uVar3 = ON_SubDEdge::FaceArrayIndex((ON_SubDEdge *)this,f);
  }
  else {
    vertex = (ON_SubDVertex *)((ulong)first & 0xfffffffffffffff8);
    if (vertex == (ON_SubDVertex *)0x0 || uVar4 != 2) {
      return false;
    }
    if (cVar1 != '\x06') {
      if (((uint)uVar2 & 0xff) != 4) {
        return false;
      }
      uVar2 = (ulong)second & 0xfffffffffffffff8;
      if (uVar2 == 0 || uVar3 != 4) {
        return false;
      }
      if (*(ON_SubDVertex **)(uVar2 + 0x80) == vertex) {
        return true;
      }
      if (*(ON_SubDVertex **)(uVar2 + 0x88) != vertex) {
        return false;
      }
      return true;
    }
    if ((ON_SubDFace *)((ulong)second & 0xfffffffffffffff8) == (ON_SubDFace *)0x0 || uVar3 != 6) {
      return false;
    }
    uVar3 = ON_SubDFace::VertexIndex((ON_SubDFace *)((ulong)second & 0xfffffffffffffff8),vertex);
  }
  if (uVar3 == 0xffffffff) {
    return false;
  }
  return true;
}

Assistant:

static const bool Internal_FirstIsPartOfSecond(
  const ON_SubDComponentPoint& first,
  const ON_SubDComponentPoint& second
)
{
  // returns true if first is topologically part of second (vertex on edge, vertex on face, or edge on face).
  const ON_SubDComponentPtr::Type first_type = first.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type second_type = second.m_component_ptr.ComponentType();
  if (first_type != second_type)
  {
    if (ON_SubDComponentPtr::Type::Vertex == first_type)
    {
      const ON_SubDVertex* v = first.m_component_ptr.Vertex();
      if (nullptr != v)
      {
        if (ON_SubDComponentPtr::Type::Edge == second_type)
        {
          const ON_SubDEdge* e = second.m_component_ptr.Edge();
          if (nullptr != e && (v == e->m_vertex[0] || v == e->m_vertex[1]))
            return true;
        }
        else if (ON_SubDComponentPtr::Type::Face == second_type)
        {
          const ON_SubDFace* f = second.m_component_ptr.Face();
          if (nullptr != f && f->VertexIndex(v) < ON_UNSET_UINT_INDEX)
            return true;
        }
      }
    }
    else if (ON_SubDComponentPtr::Type::Edge == first_type)
    {
      if (ON_SubDComponentPtr::Type::Face == second_type)
      {
        const ON_SubDEdge* e = first.m_component_ptr.Edge();
        const ON_SubDFace* f = second.m_component_ptr.Face();
        if (nullptr != e && nullptr != f && e->FaceArrayIndex(f) < ON_UNSET_UINT_INDEX)
          return true;
      }
    }
  }
  return false;
}